

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_ManPrepareGates(Bac_Man_t *p)

{
  int iVar1;
  void **ppvVar2;
  char *pcVar3;
  Mio_Gate_t *pGate_00;
  Dec_Graph_t *pDVar4;
  Mio_Gate_t *pGate;
  char *pGateName;
  int i;
  Dec_Graph_t **ppGraphs;
  Bac_Man_t *p_local;
  
  if (p->pMioLib != (void *)0x0) {
    iVar1 = Abc_NamObjNumMax(p->pMods);
    ppvVar2 = (void **)calloc((long)iVar1,8);
    for (pGateName._4_4_ = 1; iVar1 = Abc_NamObjNumMax(p->pMods), pGateName._4_4_ < iVar1;
        pGateName._4_4_ = pGateName._4_4_ + 1) {
      pcVar3 = Abc_NamStr(p->pMods,pGateName._4_4_);
      pGate_00 = Mio_LibraryReadGateByName((Mio_Library_t *)p->pMioLib,pcVar3,(char *)0x0);
      if (pGate_00 != (Mio_Gate_t *)0x0) {
        pcVar3 = Mio_GateReadSop(pGate_00);
        pDVar4 = Dec_Factor(pcVar3);
        ppvVar2[pGateName._4_4_] = pDVar4;
      }
    }
    if (p->ppGraphs != (void **)0x0) {
      __assert_fail("p->ppGraphs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                    ,0x3d,"void Bac_ManPrepareGates(Bac_Man_t *)");
    }
    p->ppGraphs = ppvVar2;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Bac_ManPrepareGates( Bac_Man_t * p )
{
    Dec_Graph_t ** ppGraphs; int i;
    if ( p->pMioLib == NULL )
        return;
    ppGraphs = ABC_CALLOC( Dec_Graph_t *, Abc_NamObjNumMax(p->pMods) );
    for ( i = 1; i < Abc_NamObjNumMax(p->pMods); i++ )
    {
        char * pGateName = Abc_NamStr( p->pMods, i );
        Mio_Gate_t * pGate = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pMioLib, pGateName, NULL );
        if ( pGate != NULL )
            ppGraphs[i] = Dec_Factor( Mio_GateReadSop(pGate) );
    }
    assert( p->ppGraphs == NULL );
    p->ppGraphs = (void **)ppGraphs;
}